

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O2

int __thiscall ncnn::InnerProduct_x86::create_pipeline(InnerProduct_x86 *this,Option *opt)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  Mat *this_00;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  int *piVar6;
  Allocator *pAVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  Layer *pLVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  ulong uVar29;
  undefined4 *puVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long local_90;
  ParamDict pd;
  size_t local_68;
  Allocator *local_58;
  int local_4c;
  
  pLVar23 = create_layer_cpu(0xe);
  this->flatten = pLVar23;
  ParamDict::ParamDict(&pd);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&pd);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict(&pd);
  if ((opt->use_int8_inference == true) && ((this->super_InnerProduct).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
  }
  else {
    iVar25 = (this->super_InnerProduct).weight_data_size;
    iVar3 = (this->super_InnerProduct).num_output;
    iVar27 = iVar25 / iVar3;
    this_00 = &(this->super_InnerProduct).weight_data;
    if ((((long)iVar3 & 3U) == 0) && (opt->use_packing_layout != false)) {
      Mat::reshape((Mat *)&pd,this_00,iVar27,iVar3,(Allocator *)0x0);
      Mat::create(&this->weight_data_tm,iVar27,iVar3 >> 2,0x10,4,(Allocator *)0x0);
      lVar24 = 3;
      lVar36 = 2;
      local_90 = 1;
      lVar28 = 0;
      for (uVar29 = 0; (long)(uVar29 | 3) < (long)iVar3; uVar29 = uVar29 + 4) {
        lVar26 = (long)(this->weight_data_tm).w;
        pvVar4 = (this->weight_data_tm).data;
        sVar5 = (this->weight_data_tm).elemsize;
        puVar30 = (undefined4 *)((uVar29 >> 2) * lVar26 * sVar5 + (long)pvVar4);
        lVar33 = (long)local_4c;
        lVar31 = local_68 * lVar24 * lVar33;
        lVar32 = local_68 * lVar36 * lVar33;
        lVar35 = local_68 * local_90 * lVar33;
        lVar33 = local_68 * uVar29 * lVar33;
        lVar26 = sVar5 * lVar28 * lVar26;
        lVar37 = 0;
        lVar34 = 0;
        for (iVar25 = 0; iVar25 + 3 < iVar27; iVar25 = iVar25 + 4) {
          puVar1 = (undefined4 *)((long)pd._vptr_ParamDict + lVar34 + lVar33);
          uVar8 = puVar1[1];
          uVar9 = puVar1[2];
          uVar10 = puVar1[3];
          puVar2 = (undefined4 *)((long)pd._vptr_ParamDict + lVar34 + lVar35);
          uVar11 = *puVar2;
          uVar12 = puVar2[1];
          uVar13 = puVar2[2];
          uVar14 = puVar2[3];
          puVar2 = (undefined4 *)((long)pd._vptr_ParamDict + lVar34 + lVar32);
          uVar15 = *puVar2;
          uVar16 = puVar2[1];
          uVar17 = puVar2[2];
          uVar18 = puVar2[3];
          puVar2 = (undefined4 *)((long)pd._vptr_ParamDict + lVar34 + lVar31);
          uVar19 = *puVar2;
          uVar20 = puVar2[1];
          uVar21 = puVar2[2];
          uVar22 = puVar2[3];
          puVar2 = (undefined4 *)((long)pvVar4 + lVar34 * 4 + lVar26);
          *puVar2 = *puVar1;
          puVar2[1] = uVar11;
          puVar2[2] = uVar15;
          puVar2[3] = uVar19;
          puVar1 = (undefined4 *)((long)pvVar4 + lVar34 * 4 + lVar26 + 0x10);
          *puVar1 = uVar8;
          puVar1[1] = uVar12;
          puVar1[2] = uVar16;
          puVar1[3] = uVar20;
          puVar1 = (undefined4 *)((long)pvVar4 + lVar34 * 4 + lVar26 + 0x20);
          *puVar1 = uVar9;
          puVar1[1] = uVar13;
          puVar1[2] = uVar17;
          puVar1[3] = uVar21;
          puVar1 = (undefined4 *)((long)pvVar4 + lVar34 * 4 + lVar26 + 0x30);
          *puVar1 = uVar10;
          puVar1[1] = uVar14;
          puVar1[2] = uVar18;
          puVar1[3] = uVar22;
          puVar30 = puVar30 + 0x10;
          lVar34 = lVar34 + 0x10;
          lVar37 = lVar37 + 4;
        }
        for (; (int)lVar37 < iVar27; lVar37 = lVar37 + 1) {
          *puVar30 = *(undefined4 *)((long)pd._vptr_ParamDict + lVar37 * 4 + lVar33);
          puVar30[1] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar37 * 4 + lVar35);
          puVar30[2] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar37 * 4 + lVar32);
          puVar30[3] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar37 * 4 + lVar31);
          puVar30 = puVar30 + 4;
        }
        lVar24 = lVar24 + 4;
        lVar36 = lVar36 + 4;
        local_90 = local_90 + 4;
        lVar28 = lVar28 + 1;
      }
      if (pd.d != (ParamDictPrivate *)0x0) {
        LOCK();
        (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
        UNLOCK();
        if ((pd.d)->params[0].type == 0) {
          if (local_58 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_58->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      piVar6 = (this->super_InnerProduct).weight_data.refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (this->weight_data_tm).refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          pvVar4 = (this->weight_data_tm).data;
          pAVar7 = (this->weight_data_tm).allocator;
          if (pAVar7 == (Allocator *)0x0) {
            free(pvVar4);
          }
          else {
            (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar4,(long)iVar25 % (long)iVar3 & 0xffffffff);
          }
        }
      }
      piVar6 = (this->super_InnerProduct).weight_data.refcount;
      (this->weight_data_tm).data = (this->super_InnerProduct).weight_data.data;
      (this->weight_data_tm).refcount = piVar6;
      (this->weight_data_tm).elemsize = (this->super_InnerProduct).weight_data.elemsize;
      (this->weight_data_tm).elempack = (this->super_InnerProduct).weight_data.elempack;
      (this->weight_data_tm).allocator = (this->super_InnerProduct).weight_data.allocator;
      iVar25 = (this->super_InnerProduct).weight_data.w;
      iVar3 = (this->super_InnerProduct).weight_data.h;
      iVar27 = (this->super_InnerProduct).weight_data.d;
      (this->weight_data_tm).dims = (this->super_InnerProduct).weight_data.dims;
      (this->weight_data_tm).w = iVar25;
      (this->weight_data_tm).h = iVar3;
      (this->weight_data_tm).d = iVar27;
      (this->weight_data_tm).c = (this->super_InnerProduct).weight_data.c;
      (this->weight_data_tm).cstep = (this->super_InnerProduct).weight_data.cstep;
    }
    if (opt->lightmode == true) {
      piVar6 = (this->super_InnerProduct).weight_data.refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          pAVar7 = (this->super_InnerProduct).weight_data.allocator;
          if (pAVar7 == (Allocator *)0x0) {
            free((this->super_InnerProduct).weight_data.data);
          }
          else {
            (*pAVar7->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_InnerProduct).weight_data.cstep = 0;
      *(undefined8 *)((long)&(this->super_InnerProduct).weight_data.refcount + 4) = 0;
      *(undefined8 *)((long)&(this->super_InnerProduct).weight_data.elemsize + 4) = 0;
      this_00->data = (void *)0x0;
      (this->super_InnerProduct).weight_data.refcount = (int *)0x0;
      (this->super_InnerProduct).weight_data.dims = 0;
      (this->super_InnerProduct).weight_data.w = 0;
      (this->super_InnerProduct).weight_data.h = 0;
      (this->super_InnerProduct).weight_data.d = 0;
      (this->super_InnerProduct).weight_data.c = 0;
    }
  }
  return 0;
}

Assistant:

int InnerProduct_x86::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer_cpu(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}